

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5AsciiTokenize(Fts5Tokenizer *pTokenizer,void *pCtx,int iUnused,char *pText,int nText,
                     _func_int_void_ptr_int_char_ptr_int_int_int *xToken)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int nByte;
  uchar *a;
  char *pFold;
  uchar local_98 [4];
  int nFold;
  char aFold [64];
  int local_4c;
  int local_48;
  int is;
  int ie;
  int rc;
  AsciiTokenizer *p;
  _func_int_void_ptr_int_char_ptr_int_int_int *xToken_local;
  int nText_local;
  char *pText_local;
  int iUnused_local;
  void *pCtx_local;
  Fts5Tokenizer *pTokenizer_local;
  
  is = 0;
  local_4c = 0;
  pFold._4_4_ = 0x40;
  a = local_98;
  do {
    if (nText <= local_4c || is != 0) {
LAB_001edeae:
      if (a != local_98) {
        sqlite3_free(a);
      }
      if (is == 0x65) {
        is = 0;
      }
      return is;
    }
    while( true ) {
      bVar3 = false;
      if ((local_4c < nText) && (bVar3 = false, ((int)pText[local_4c] & 0x80U) == 0)) {
        bVar3 = pTokenizer[(int)pText[local_4c]] == (Fts5Tokenizer)0x0;
      }
      if (!bVar3) break;
      local_4c = local_4c + 1;
    }
    iVar2 = local_4c;
    if (local_4c == nText) goto LAB_001edeae;
    do {
      iVar1 = iVar2;
      local_48 = iVar1 + 1;
      bVar3 = false;
      if ((local_48 < nText) && (bVar3 = true, ((int)pText[local_48] & 0x80U) == 0)) {
        bVar3 = pTokenizer[(int)pText[local_48]] != (Fts5Tokenizer)0x0;
      }
      iVar2 = local_48;
    } while (bVar3);
    iVar2 = local_48 - local_4c;
    if (pFold._4_4_ < iVar2) {
      if (a != local_98) {
        sqlite3_free(a);
      }
      a = (uchar *)sqlite3_malloc64((long)iVar2 << 1);
      if (a == (uchar *)0x0) {
        is = 7;
        goto LAB_001edeae;
      }
      pFold._4_4_ = iVar2 * 2;
    }
    asciiFold((char *)a,pText + local_4c,iVar2);
    is = (*xToken)(pCtx,0,(char *)a,iVar2,local_4c,local_48);
    local_4c = iVar1 + 2;
  } while( true );
}

Assistant:

static int fts5AsciiTokenize(
  Fts5Tokenizer *pTokenizer,
  void *pCtx,
  int iUnused,
  const char *pText, int nText,
  int (*xToken)(void*, int, const char*, int nToken, int iStart, int iEnd)
){
  AsciiTokenizer *p = (AsciiTokenizer*)pTokenizer;
  int rc = SQLITE_OK;
  int ie;
  int is = 0;

  char aFold[64];
  int nFold = sizeof(aFold);
  char *pFold = aFold;
  unsigned char *a = p->aTokenChar;

  UNUSED_PARAM(iUnused);

  while( is<nText && rc==SQLITE_OK ){
    int nByte;

    /* Skip any leading divider characters. */
    while( is<nText && ((pText[is]&0x80)==0 && a[(int)pText[is]]==0) ){
      is++;
    }
    if( is==nText ) break;

    /* Count the token characters */
    ie = is+1;
    while( ie<nText && ((pText[ie]&0x80) || a[(int)pText[ie]] ) ){
      ie++;
    }

    /* Fold to lower case */
    nByte = ie-is;
    if( nByte>nFold ){
      if( pFold!=aFold ) sqlite3_free(pFold);
      pFold = sqlite3_malloc64((sqlite3_int64)nByte*2);
      if( pFold==0 ){
        rc = SQLITE_NOMEM;
        break;
      }
      nFold = nByte*2;
    }
    asciiFold(pFold, &pText[is], nByte);

    /* Invoke the token callback */
    rc = xToken(pCtx, 0, pFold, nByte, is, ie);
    is = ie+1;
  }
  
  if( pFold!=aFold ) sqlite3_free(pFold);
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  return rc;
}